

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::MinMaxNOperation::
Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
          (MinMaxNOperation *this,Vector *state_vector,AggregateInputData *param_2,Vector *result,
          idx_t count,idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  idx_t iVar3;
  ArenaAllocator *this_00;
  byte bVar4;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  _Var5;
  ArenaAllocator *pAVar6;
  Allocator *size;
  Vector *pVVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  OrderModifiers modifiers;
  ulong uVar12;
  string_t sort_key;
  UnifiedVectorFormat state_format;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_b8;
  ArenaAllocator *pAStack_b0;
  Vector *local_a8;
  AggregateInputData *local_a0;
  ArenaAllocator *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  unsigned_long local_80;
  UnifiedVectorFormat local_78;
  
  modifiers = SUB82(offset,0);
  local_88 = count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)result,&local_78);
  FlatVector::VerifyFlatVector((Vector *)param_2);
  size = (Allocator *)ListVector::GetListSize((Vector *)param_2);
  if (result == (Vector *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar12 = uVar9;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_78.sel)->sel_vector[uVar9];
      }
      lVar11 = lVar11 + *(long *)(*(long *)(local_78.data + uVar12 * 8) + 0x10);
      uVar9 = uVar9 + 1;
    } while (result != (Vector *)uVar9);
  }
  ListVector::Reserve((Vector *)param_2,(long)&size->allocate_function + lVar11);
  local_98 = param_2[1].allocator;
  pVVar7 = ListVector::GetEntry((Vector *)param_2);
  if (result != (Vector *)0x0) {
    local_90 = local_78.data;
    local_a0 = param_2 + 2;
    uVar9 = 0;
    local_a8 = result;
    do {
      uVar12 = uVar9;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_78.sel)->sel_vector[uVar9];
      }
      uVar1 = uVar9 + local_88;
      lVar11 = *(long *)(local_90 + uVar12 * 8);
      if ((*(char *)(lVar11 + 0x18) == '\x01') && (iVar3 = *(idx_t *)(lVar11 + 0x10), iVar3 != 0)) {
        (&local_98->allocator)[uVar1 * 2] = size;
        (&local_98->initial_capacity)[uVar1 * 2] = iVar3;
        local_b8._M_comp = BinaryAggregateHeap<double,_duckdb::string_t,_duckdb::LessThan>::Compare;
        ::std::
        __sort_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                  (*(pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar11 + 8),
                   *(pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar11 + 8) + iVar3,&local_b8);
        if (*(long *)(lVar11 + 0x10) != 0) {
          puVar10 = (undefined8 *)(*(long *)(lVar11 + 8) + 0x10);
          uVar12 = 0;
          do {
            sort_key.value.pointer.ptr = (char *)pVVar7;
            sort_key.value._0_8_ = *puVar10;
            CreateSortKeyHelpers::DecodeSortKey
                      ((CreateSortKeyHelpers *)puVar10[-1],sort_key,
                       (Vector *)((long)&size->allocate_function + uVar12),0x302,modifiers);
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + 5;
          } while (uVar12 < *(ulong *)(lVar11 + 0x10));
          size = (Allocator *)((long)&size->allocate_function + uVar12);
          result = local_a8;
        }
      }
      else {
        if (*(long *)&param_2[1].combine_type == 0) {
          local_80 = *(unsigned_long *)&param_2[2].combine_type;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          pAVar6 = pAStack_b0;
          _Var5._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
                *)0x0;
          pAStack_b0 = (ArenaAllocator *)0x0;
          this_00 = param_2[2].allocator;
          param_2[2].bind_data.ptr = (FunctionData *)_Var5._M_comp;
          param_2[2].allocator = pAVar6;
          if (this_00 != (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if (pAStack_b0 != (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_b0);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_a0);
          *(unsigned_long **)&param_2[1].combine_type =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)uVar1 & 0x3f;
        puVar2 = (ulong *)(*(long *)&param_2[1].combine_type + (uVar1 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar9 = uVar9 + 1;
    } while ((Vector *)uVar9 != result);
  }
  ListVector::SetListSize((Vector *)param_2,(idx_t)size);
  Vector::Verify((Vector *)param_2,(idx_t)result);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}